

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientConductor.cpp
# Opt level: O0

void __thiscall
aeron::ClientConductor::lingerAllResources(ClientConductor *this,longlong now,ImageList *imageList)

{
  long in_RDX;
  Image *in_RSI;
  size_t i;
  undefined8 in_stack_ffffffffffffffa8;
  ClientConductor *in_stack_ffffffffffffffb0;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  
  if (in_RDX != 0) {
    local_18 = in_RDX;
    local_10 = in_RSI;
    for (local_20 = 0; (ulong)local_20 < *(ulong *)(local_18 + 8); local_20 = local_20 + 1) {
      in_stack_ffffffffffffffb0 = (ClientConductor *)&stack0xffffffffffffffd0;
      in_stack_ffffffffffffffa8 = local_10;
      Image::logBuffers((Image *)local_10);
      lingerResource(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                     (shared_ptr<aeron::LogBuffers> *)0x1cbb95);
      std::shared_ptr<aeron::LogBuffers>::~shared_ptr((shared_ptr<aeron::LogBuffers> *)0x1cbba1);
    }
    lingerResource(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,(ImageList *)0x1cbbdf);
  }
  return;
}

Assistant:

void ClientConductor::lingerAllResources(long long now, struct ImageList *imageList)
{
    if (nullptr != imageList)
    {
        for (std::size_t i = 0; i < imageList->m_length; i++)
        {
            lingerResource(now, imageList->m_images[i].logBuffers());
        }

        lingerResource(now, imageList);
    }
}